

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall nv::Kernel2::transpose(Kernel2 *this)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar2 = this->m_windowSize;
  uVar7 = 1;
  uVar9 = 1;
  uVar8 = uVar2;
  for (uVar4 = 0; uVar4 != uVar2; uVar4 = uVar4 + 1) {
    pfVar3 = this->m_data;
    uVar5 = uVar7;
    uVar6 = uVar8;
    for (uVar10 = (ulong)uVar9; uVar10 < uVar2; uVar10 = uVar10 + 1) {
      fVar1 = pfVar3[uVar5];
      pfVar3[uVar5] = pfVar3[uVar6];
      pfVar3[uVar6] = fVar1;
      uVar6 = uVar6 + uVar2;
      uVar5 = uVar5 + 1;
    }
    uVar9 = uVar9 + 1;
    uVar8 = uVar8 + uVar2 + 1;
    uVar7 = uVar7 + uVar2 + 1;
  }
  return;
}

Assistant:

void Kernel2::transpose()
{
	for(uint i = 0; i < m_windowSize; i++) {
		for(uint j = i+1; j < m_windowSize; j++) {
			swap(m_data[i*m_windowSize + j], m_data[j*m_windowSize + i]);
		}
	}
}